

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_NoiseAlert(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  AActor *target;
  FActorIterator iter;
  
  target = it;
  if (arg0 != 0) {
    iter.base = (AActor *)0x0;
    iter.id = arg0;
    target = FActorIterator::Next(&iter);
  }
  if ((arg1 != 0) && (it = target, arg1 != arg0)) {
    iter.base = (AActor *)0x0;
    iter.id = arg1;
    it = FActorIterator::Next(&iter);
  }
  P_NoiseAlert(target,it,false,0.0);
  return 1;
}

Assistant:

FUNC(LS_NoiseAlert)
// NoiseAlert (TID of target, TID of emitter)
{
	AActor *target, *emitter;

	if (arg0 == 0)
	{
		target = it;
	}
	else
	{
		FActorIterator iter (arg0);
		target = iter.Next();
	}

	if (arg1 == 0)
	{
		emitter = it;
	}
	else if (arg1 == arg0)
	{
		emitter = target;
	}
	else
	{
		FActorIterator iter (arg1);
		emitter = iter.Next();
	}

	P_NoiseAlert (target, emitter);
	return true;
}